

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_RemoveBezierSingAt0(int dim,int order,int cv_stride,double *cv)

{
  int iVar1;
  int local_2c;
  int ord0;
  int k;
  int j;
  int cvdim;
  double *cv_local;
  int cv_stride_local;
  int order_local;
  int dim_local;
  
  cv_local._4_4_ = order;
  do {
    if ((cv[dim] != 0.0) || (NAN(cv[dim]))) {
      while (cv_local._4_4_ < order) {
        ON_IncreaseBezierDegree(dim,true,cv_local._4_4_,cv_stride,cv);
        cv_local._4_4_ = cv_local._4_4_ + 1;
      }
      return true;
    }
    cv_local._4_4_ = cv_local._4_4_ + -1;
    ord0 = dim;
    if (cv_local._4_4_ < 2) {
      return false;
    }
    while (iVar1 = ord0 + -1, ord0 != 0) {
      if ((cv[iVar1] != 0.0) || (ord0 = iVar1, NAN(cv[iVar1]))) {
        return false;
      }
    }
    for (ord0 = 0; ord0 < cv_local._4_4_; ord0 = ord0 + 1) {
      for (local_2c = 0; local_2c < dim + 1; local_2c = local_2c + 1) {
        cv[ord0 * cv_stride + local_2c] =
             ((double)cv_local._4_4_ * cv[(ord0 + 1) * cv_stride + local_2c]) / (double)(ord0 + 1);
      }
    }
  } while( true );
}

Assistant:

bool ON_RemoveBezierSingAt0(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int j,k,ord0;
  ord0 = order;
  while(cv[dim] == 0.0) {
    order--; 
    if (order < 2)
      return false;
    j = dim; 
    while(j--) {
      if (cv[j] != 0.0) 
        return false;
    }
    for (j=0;  j<order;  j++) {
      for (k=0;  k<cvdim;  k++) 
        cv[j*cv_stride+k] = (order*cv[(j+1)*cv_stride+k])/(j+1);
    }
  }
  while (order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return true;
}